

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_transporter.cpp
# Opt level: O1

void __thiscall SocketServerTransporter::~SocketServerTransporter(SocketServerTransporter *this)

{
  char *__ptr;
  
  (this->super_Transporter)._vptr_Transporter = (_func_int **)&PTR__Transporter_0017f4c8;
  __ptr = (this->super_Transporter).buf;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  (*(this->super_Transporter)._vptr_Transporter[2])(this);
  if ((this->super_Transporter).thread._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->super_Transporter).thread._M_id._M_thread != 0) {
    std::terminate();
  }
  return;
}

Assistant:

bool SocketServerTransporter::Listen(const std::string& host, int port, std::string& err) {
	uvServer.data = this;
	uv_tcp_init(loop, &uvServer);
	struct sockaddr_storage addr;
	bool addr_suc = ParseSocketAddress(host, port, &addr, err);
	if (!addr_suc) {
		return false;
	}

	uv_tcp_bind(&uvServer, reinterpret_cast<const struct sockaddr*>(&addr), 0);
	const int r = uv_listen(reinterpret_cast<uv_stream_t*>(&uvServer), SOMAXCONN, on_new_connection);
	if (r) {
		err = uv_strerror(r);
		return false;
	}
	StartEventLoop();
	return true;
}